

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkWriter::save(PlainTextNetworkWriter *this,LayerSpec *spec)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  element_type *weights;
  element_type *bias;
  LayerSpec *spec_local;
  PlainTextNetworkWriter *this_local;
  
  poVar2 = std::operator<<(this->out,"layer: ");
  poVar2 = std::operator<<(poVar2,(string *)spec);
  std::operator<<(poVar2,"\n");
  if (spec->inputDim != 0) {
    poVar2 = std::operator<<(this->out,"inputs: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,spec->inputDim);
    std::operator<<(poVar2,"\n");
  }
  if (spec->outputDim != 0) {
    poVar2 = std::operator<<(this->out,"outputs: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,spec->outputDim);
    std::operator<<(poVar2,"\n");
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&spec->activation);
  if (bVar1) {
    poVar2 = std::operator<<(this->out,"activation: ");
    peVar3 = core::std::
             __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&spec->activation);
    poVar2 = std::operator<<(poVar2,(string *)peVar3);
    std::operator<<(poVar2,"\n");
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&spec->weights);
  if ((bVar1) &&
     (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&spec->bias), bVar1)) {
    std::operator<<(this->out,"bias_and_weights:\n");
    weights = core::std::
              __shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&spec->weights);
    bias = core::std::
           __shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&spec->bias);
    saveWeightsAndBias(this,weights,bias);
  }
  return;
}

Assistant:

void save(LayerSpec &spec) {
        out << "layer: " << spec.tag << "\n";
        if (spec.inputDim) {
            out << "inputs: " << spec.inputDim << "\n";
        }
        if (spec.outputDim) {
            out << "outputs: " << spec.outputDim << "\n";
        }
        if (spec.activation) {
            out << "activation: " << *spec.activation << "\n";
        }
        if (spec.weights && spec.bias) {
            out << "bias_and_weights:\n";
            saveWeightsAndBias(*spec.weights, *spec.bias);
        }
    }